

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::addInvocations(TranslateToFuzzReader *this,Function *func)

{
  Module *pMVar1;
  string_view target;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  undefined1 auVar3 [8];
  size_t type;
  bool bVar4;
  long lVar5;
  Block *pBVar6;
  uintptr_t *puVar7;
  Type type_00;
  ulong extraout_RDX;
  Name NVar8;
  Name NVar9;
  Name name_00;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  undefined1 auStack_158 [8];
  FunctionCreationContext context;
  undefined1 auStack_c8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  _Variadic_union<wasm::Name,_wasm::HeapType> local_a8;
  Builder *local_98;
  Function *local_90;
  undefined1 auStack_88 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invocations;
  undefined1 auStack_60 [8];
  Name name;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> invoker;
  Expression *invoke;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> local_38;
  
  local_90 = func;
  IString::toString_abi_cxx11_((string *)auStack_c8,(IString *)func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"_invoker",(allocator<char> *)&invoker);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88);
  IString::IString((IString *)auStack_60,(string *)auStack_158);
  std::__cxx11::string::~string((string *)auStack_158);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_c8);
  NVar8.super_IString.str._M_str = (char *)auStack_60;
  NVar8.super_IString.str._M_len = (size_t)this->wasm;
  lVar5 = wasm::Module::getFunctionOrNull(NVar8);
  if ((lVar5 == 0) &&
     (NVar9.super_IString.str._M_str = (char *)auStack_60,
     NVar9.super_IString.str._M_len = (size_t)this->wasm,
     lVar5 = wasm::Module::getExportOrNull(NVar9), type = name.super_IString.str._M_len,
     auVar3 = auStack_60, lVar5 == 0)) {
    wasm::HeapType::HeapType
              ((HeapType *)&context.typeLocals._M_h._M_single_bucket,(Signature)ZEXT816(0));
    auStack_158 = (undefined1  [8])0x0;
    context.parent = (TranslateToFuzzReader *)0x0;
    context.func = (Function *)0x0;
    name_00.super_IString.str._M_str = (char *)auVar3;
    name_00.super_IString.str._M_len = (size_t)&name.super_IString.str._M_str;
    Builder::makeFunction
              (name_00,(HeapType)type,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               context.typeLocals._M_h._M_single_bucket,(Expression *)auStack_158);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_158);
    pBVar6 = MixedArena::alloc<wasm::Block>(&((this->builder).wasm)->allocator);
    *(Block **)(name.super_IString.str._M_str + 0x60) = pBVar6;
    FunctionCreationContext::FunctionCreationContext
              ((FunctionCreationContext *)auStack_158,this,(Function *)name.super_IString.str._M_str
              );
    local_98 = &this->builder;
    invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_88 = (undefined1  [8])0x0;
    invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_first._M_storage.super_IString.str._M_str = (char *)&this->random;
    while ((bVar4 = Random::oneIn((Random *)local_a8._M_first._M_storage.super_IString.str._M_str,2)
           , bVar4 && ((this->random).finishedInput == false))) {
      auStack_c8 = (undefined1  [8])0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)wasm::HeapType::getSignature()
      ;
      invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           &local_38;
      invoke = (Expression *)0x0;
      PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               Type::end((Type *)invoker._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      for (; PVar2.index = (size_t)invoke,
          PVar2.parent = (Type *)invoker._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
          PVar10 != PVar2; invoke = (Expression *)&invoke->field_0x1) {
        puVar7 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)&invoker);
        local_a8._M_first._M_storage.super_IString.str._M_len =
             (size_t)makeConst(this,(Type)*puVar7);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_c8,
                   (Expression **)&local_a8._M_rest);
      }
      target = (local_90->super_Importable).super_Named.name.super_IString.str;
      wasm::HeapType::getSignature();
      invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           Builder::makeCall(local_98,(Name)target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_c8,type_00,false);
      wasm::HeapType::getSignature();
      if (1 < extraout_RDX) {
        invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
        _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             Builder::makeDrop(local_98,(Expression *)
                                        invoker._M_t.
                                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl
                              );
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_88,
                 (value_type *)&invoker);
      if (((this->hashMemoryName).super_IString.str._M_str != (char *)0x0) &&
         (bVar4 = Random::oneIn((Random *)local_a8._M_first._M_storage.super_IString.str._M_str,2),
         bVar4)) {
        local_38._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
             (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)makeMemoryHashLogging(this);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_88,
                   (Expression **)&local_38);
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_c8
                );
    }
    if (auStack_88 !=
        (undefined1  [8])
        invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pBVar6->list,
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_88);
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      if (this->preserveImportsAndExports == false) {
        pMVar1 = this->wasm;
        auStack_c8 = auStack_60;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)name.super_IString.str._M_len;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)args.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
        _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             auStack_60;
        local_a8._M_first._M_storage.super_IString.str._M_len =
             local_a8._M_first._M_storage.super_IString.str._M_len & 0xffffffff00000000;
        std::
        make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                  ((Name *)&local_38,(ExternalKind *)&invoker,
                   (variant<wasm::Name,_wasm::HeapType> *)&local_a8._M_first);
        wasm::Module::addExport((unique_ptr *)pMVar1);
        std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                  ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_38);
      }
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_88);
    FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)auStack_158);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &name.super_IString.str._M_str);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addInvocations(Function* func) {
  Name name = func->name.toString() + std::string("_invoker");
  if (wasm.getFunctionOrNull(name) || wasm.getExportOrNull(name)) {
    return;
  }
  auto invoker = builder.makeFunction(name, Signature(), {});
  Block* body = builder.makeBlock();
  invoker->body = body;
  FunctionCreationContext context(*this, invoker.get());
  std::vector<Expression*> invocations;
  while (oneIn(2) && !random.finished()) {
    std::vector<Expression*> args;
    for (const auto& type : func->getParams()) {
      args.push_back(makeConst(type));
    }
    Expression* invoke = builder.makeCall(func->name, args, func->getResults());
    if (func->getResults().isConcrete()) {
      invoke = builder.makeDrop(invoke);
    }
    invocations.push_back(invoke);
    // log out memory in some cases
    if (hashMemoryName && oneIn(2)) {
      invocations.push_back(makeMemoryHashLogging());
    }
  }
  if (invocations.empty()) {
    return;
  }
  body->list.set(invocations);
  wasm.addFunction(std::move(invoker));

  // Most of the benefit of invocations is lost when we do not add exports for
  // them, but still, they might be called by existing functions.
  if (!preserveImportsAndExports) {
    wasm.addExport(builder.makeExport(name, name, ExternalKind::Function));
  }
}